

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_d4e6::VectorMerge<signed_char>::Run
          (VectorMerge<signed_char> *this,istream *input_stream,istream *insert_stream,
          bool *eof_reached)

{
  pointer __src;
  bool bVar1;
  int iVar2;
  size_t __n;
  bool bVar3;
  vector<signed_char,_std::allocator<signed_char>_> garbage;
  vector<signed_char,_std::allocator<signed_char>_> merged_vector;
  allocator_type local_69;
  bool *local_68;
  _Vector_base<signed_char,_std::allocator<signed_char>_> local_60;
  _Vector_base<signed_char,_std::allocator<signed_char>_> local_48;
  
  if ((this->recursive_ != true) || (bVar1 = true, this->has_vector_ == true)) {
    local_68 = eof_reached;
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)&local_48,
               (long)this->merged_length_,(allocator_type *)&local_60);
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)&local_60,
               (long)this->input_skip_length_,&local_69);
    do {
      if (0 < this->insert_point_) {
        bVar1 = sptk::ReadStream<signed_char>
                          (false,0,0,this->insert_point_,
                           (vector<signed_char,_std::allocator<signed_char>_> *)&local_48,
                           input_stream,(int *)0x0);
        if (bVar1) goto LAB_001052ce;
LAB_00105387:
        bVar1 = true;
        if (local_68 != (bool *)0x0) {
          iVar2 = std::istream::peek();
          if (iVar2 == -1) {
            iVar2 = std::istream::peek();
            bVar3 = iVar2 == -1;
          }
          else {
            bVar3 = false;
          }
          *local_68 = bVar3;
        }
        goto LAB_001053b7;
      }
LAB_001052ce:
      if (this->recursive_ == true) {
        __src = (this->insert_vector_).super__Vector_base<signed_char,_std::allocator<signed_char>_>
                ._M_impl.super__Vector_impl_data._M_start;
        __n = (long)(this->insert_vector_).
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src;
        if (__n != 0) {
          memmove(local_48._M_impl.super__Vector_impl_data._M_start + this->insert_point_,__src,__n)
          ;
        }
      }
      else {
        bVar1 = sptk::ReadStream<signed_char>
                          (false,0,this->insert_point_,this->insert_length_,
                           (vector<signed_char,_std::allocator<signed_char>_> *)&local_48,
                           insert_stream,(int *)0x0);
        if (!bVar1) goto LAB_00105387;
      }
      iVar2 = this->input_skip_length_;
      if (this->input_rest_length_ < 1) {
        if (0 < iVar2) {
          bVar1 = sptk::ReadStream<signed_char>
                            (false,0,0,iVar2,
                             (vector<signed_char,_std::allocator<signed_char>_> *)&local_60,
                             input_stream,(int *)0x0);
          goto LAB_00105362;
        }
      }
      else {
        bVar1 = sptk::ReadStream<signed_char>
                          (false,iVar2,this->insert_length_ + this->insert_point_,
                           this->input_rest_length_,
                           (vector<signed_char,_std::allocator<signed_char>_> *)&local_48,
                           input_stream,(int *)0x0);
LAB_00105362:
        if (bVar1 == false) goto LAB_00105387;
      }
      bVar1 = sptk::WriteStream<signed_char>
                        (0,this->merged_length_,
                         (vector<signed_char,_std::allocator<signed_char>_> *)&local_48,
                         (ostream *)&std::cout,(int *)0x0);
    } while (bVar1);
    bVar1 = false;
LAB_001053b7:
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base(&local_60);
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base(&local_48);
  }
  return bVar1;
}

Assistant:

bool Run(std::istream* input_stream, std::istream* insert_stream,
           bool* eof_reached) const override {
    if (recursive_ && !has_vector_) {
      return true;
    }

    std::vector<T> merged_vector(merged_length_);
    std::vector<T> garbage(input_skip_length_);
    for (;;) {
      if (0 < insert_point_) {
        if (!sptk::ReadStream(false, 0, 0, insert_point_, &merged_vector,
                              input_stream, NULL)) {
          break;
        }
      }
      if (recursive_) {
        std::copy(insert_vector_.begin(), insert_vector_.end(),
                  merged_vector.begin() + insert_point_);
      } else if (!sptk::ReadStream(false, 0, insert_point_, insert_length_,
                                   &merged_vector, insert_stream, NULL)) {
        break;
      }
      if (0 < input_rest_length_) {
        if (!sptk::ReadStream(
                false, input_skip_length_, insert_point_ + insert_length_,
                input_rest_length_, &merged_vector, input_stream, NULL)) {
          break;
        }
      } else if (0 < input_skip_length_) {
        if (!sptk::ReadStream(false, 0, 0, input_skip_length_, &garbage,
                              input_stream, NULL)) {
          break;
        }
      }
      if (!sptk::WriteStream(0, merged_length_, merged_vector, &std::cout,
                             NULL)) {
        return false;
      }
    }

    if (NULL != eof_reached) {
      *eof_reached =
          (input_stream->peek() == std::istream::traits_type::eof() &&
           insert_stream->peek() == std::istream::traits_type::eof());
    }
    return true;
  }